

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

JsArrayKills __thiscall GlobOpt::CheckJsArrayKills(GlobOpt *this,Instr *instr)

{
  ushort uVar1;
  uint uVar2;
  JnHelperMethod JVar3;
  Sym *pSVar4;
  StElemInfo *pSVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  OpndKind OVar10;
  ValueType VVar11;
  uint uVar12;
  int iVar13;
  undefined4 *puVar14;
  PropertySymOpnd *pPVar15;
  undefined4 extraout_var;
  Opnd *this_00;
  HelperCallOpnd *pHVar16;
  IndirOpnd *pIVar17;
  ProfiledInstr *pPVar18;
  ulong uVar19;
  anon_union_1_2_471f577c_for_JsArrayKills_0 aVar20;
  BasicBlock *pBVar21;
  Loop *pLVar22;
  anon_union_1_2_471f577c_for_JsArrayKills_0 aVar23;
  uint uVar24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  uint local_44;
  ValueType arrayValueType;
  Loop *pLStack_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  char local_31;
  ValueType arrayValueType_1;
  ValueType arrayValueType_2;
  ValueType arrayValueType_3;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3564,"(instr)","instr");
    if (!bVar7) goto LAB_00444ecb;
    *puVar14 = 0;
  }
  bVar7 = IR::Instr::UsesAllFields(instr);
  if (bVar7) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x1;
  }
  uVar24 = *(uint *)&this->field_0xf4 & 0x8000;
  bVar7 = DoNativeArrayTypeSpec(this->func);
  VVar11 = ValueType::GetObject(Array);
  bVar8 = DoArraySegmentHoist(this,VVar11);
  VVar11 = ValueType::GetObject(ObjectWithArray);
  bVar9 = DoArraySegmentHoist(this,VVar11);
  if (bVar8 != bVar9) {
    AssertCount = AssertCount + 1;
    pLStack_40 = (Loop *)instr;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3572,
                       "(doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray)))"
                       ,
                       "doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray))"
                      );
    if (!bVar9) goto LAB_00444ecb;
    *puVar14 = 0;
    instr = (Instr *)pLStack_40;
  }
  uVar2 = *(uint *)&this->field_0xf4;
  if ((bool)(~((bVar7 || bVar8) || uVar24 != 0) & (uVar2 >> 0x12 & 1) == 0)) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
  }
  pLStack_40 = this->prePassLoop;
  uVar1 = *(ushort *)&(((Loop *)instr)->blockList).allocator;
  local_31 = bVar7;
  if (uVar1 < 0x127) {
    uVar19 = (ulong)(uVar1 - 0x70);
    if (uVar1 - 0x70 < 0x36) {
      if ((0x3000041UL >> (uVar19 & 0x3f) & 1) != 0) goto LAB_004445b5;
      if ((0x140000000000U >> (uVar19 & 0x3f) & 1) != 0) {
LAB_0044477b:
        pLVar22 = ((Loop *)instr)->parent;
        if (pLVar22 != (Loop *)0x0) {
LAB_004447e0:
          OVar10 = IR::Opnd::GetKind((Opnd *)pLVar22);
          if (OVar10 != OpndKindIndir) {
            return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
          }
          if (pLStack_40 == (Loop *)0x0) {
            pIVar17 = IR::Opnd::AsIndirOpnd((Opnd *)((Loop *)instr)->parent);
            local_48 = (pIVar17->m_baseOpnd->super_Opnd).m_valueType.field_0;
            bVar7 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_48.field_0);
            if (bVar7) {
              return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
            }
          }
          else {
            local_48.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
          }
          if (*(char *)((long)&((Loop *)instr)->next + 1) != '\x04') {
            return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
          }
          pPVar18 = IR::Instr::AsProfiledInstr(instr);
          pSVar5 = (pPVar18->u).stElemInfo;
          aVar20.bits = '\0';
          if ((bVar8) && (aVar20.bits = '0', ((pSVar5->field_2).bits & 0x12) == 0)) {
            aVar20.bits = '\0';
          }
          if ((uVar2 >> 0x12 & 1) != 0) {
            if ((pLStack_40 == (Loop *)0x0) &&
               (bVar7 = ValueType::IsNotArray((ValueType *)&local_48.field_0), bVar7)) {
              return (JsArrayKills)aVar20;
            }
            return (JsArrayKills)
                   (anon_union_1_2_471f577c_for_JsArrayKills_0)
                   ((pSVar5->field_2).bits * '\x02' & 0x40 | aVar20.bits);
          }
          return (JsArrayKills)aVar20.field_0;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3584,"(instr->GetDst())","instr->GetDst()");
        if (bVar7) {
          *puVar14 = 0;
          pLVar22 = ((Loop *)instr)->parent;
          goto LAB_004447e0;
        }
        goto LAB_00444ecb;
      }
      if ((0x30000000000000U >> (uVar19 & 0x3f) & 1) != 0) {
        pBVar21 = ((Loop *)instr)->landingPad;
        if (pBVar21 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x35a3,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar7) goto LAB_00444ecb;
          *puVar14 = 0;
          pBVar21 = ((Loop *)instr)->landingPad;
        }
        OVar10 = IR::Opnd::GetKind((Opnd *)pBVar21);
        if (OVar10 != OpndKindIndir) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        if (pLStack_40 == (Loop *)0x0) {
          pIVar17 = IR::Opnd::AsIndirOpnd((Opnd *)((Loop *)instr)->landingPad);
          local_4c = (pIVar17->m_baseOpnd->super_Opnd).m_valueType.field_0;
          bVar7 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_4c.field_0);
          if (bVar7) {
            return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
          }
        }
        aVar20.bits = (byte)(uVar24 >> 0xe);
        if (!bVar8) {
          return (JsArrayKills)aVar20;
        }
        return (JsArrayKills)(aVar20.bits + ' ');
      }
    }
    if (uVar1 != 0xcc) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
LAB_004448a6:
    if (local_31 == '\0') {
      return (anon_union_1_2_471f577c_for_JsArrayKills_0)
             (anon_struct_1_7_08142c7c_for_anon_union_1_2_471f577c_for_JsArrayKills_0_0)0x0;
    }
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x8;
  }
  uVar12 = (uint)uVar1;
  if (uVar1 < 0x1bb) {
    uVar12 = uVar12 - 0x127;
    if (0x30 < uVar12) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    if ((0x1805UL >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
      if ((ulong)uVar12 != 0x30) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      pBVar21 = ((Loop *)instr)->landingPad;
      if (pBVar21 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3675,"(arrayOpnd)","arrayOpnd");
        if (!bVar7) goto LAB_00444ecb;
        *puVar14 = 0;
      }
      local_46 = ((ValueType *)&pBVar21->prev)->field_0;
      OVar10 = IR::Opnd::GetKind((Opnd *)pBVar21);
      if (OVar10 != OpndKindReg) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      if (pLStack_40 == (Loop *)0x0) {
        bVar7 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_46.field_0);
        if (local_31 != '\x01' || bVar7) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        bVar7 = ValueType::IsNotNativeArray((ValueType *)&local_46.field_0);
        if (!bVar7) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x8;
        }
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      goto LAB_004448a6;
    }
LAB_004445b5:
    if (((Loop *)instr)->parent == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x35bc,"(instr->GetDst())","instr->GetDst()");
      if (!bVar7) goto LAB_00444ecb;
      *puVar14 = 0;
    }
    if ((~bVar8 & (uVar2 >> 0x12 & 1) == 0) != 0) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    pLVar22 = ((Loop *)instr)->parent;
    OVar10 = IR::Opnd::GetKind((Opnd *)pLVar22);
    if (OVar10 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00444ecb;
      *puVar14 = 0;
    }
    bVar7 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)pLVar22);
    if (!bVar7) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    pPVar15 = IR::Opnd::AsPropertySymOpnd((Opnd *)pLVar22);
    pSVar4 = (pPVar15->super_SymOpnd).m_sym;
    if (pSVar4->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar7) {
LAB_00444ecb:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar14 = 0;
    }
    if (*(int *)&pSVar4[1]._vptr_Sym != 0xd1) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    if (pLStack_40 == (Loop *)0x0) {
      local_4a = (pPVar15->super_SymOpnd).propertyOwnerValueType.field_0;
      bVar7 = ValueType::IsNotArray((ValueType *)&local_4a.field_0);
      if (bVar7) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
    }
    if ((uVar2 & 0x40000) == 0) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(bVar8 << 5);
    }
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(bVar8 << 5 | 0x40);
  }
  if (0x22b < uVar12) {
    if (uVar12 != 0x26a) {
      if (uVar12 != 0x269) {
        if (uVar1 != 0x22c) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        goto LAB_0044477b;
      }
      pBVar21 = ((Loop *)instr)->landingPad;
      if (pBVar21 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x360f,"(arrayOpnd)","arrayOpnd");
        if (!bVar7) goto LAB_00444ecb;
        *puVar14 = 0;
      }
      local_38 = ((ValueType *)&pBVar21->prev)->field_0;
      OVar10 = IR::Opnd::GetKind((Opnd *)pBVar21);
      if (OVar10 != OpndKindReg) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      if (pLStack_40 == (Loop *)0x0) {
        bVar7 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_38.field_0);
        if (bVar7) {
          return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
        }
        aVar20.bits = bVar8 << 5;
        if ((uVar2 >> 0x12 & 1) == 0) goto LAB_00444e00;
        bVar7 = ValueType::IsNotArray((ValueType *)&local_38.field_0);
        if (!bVar7) goto LAB_004449e2;
        if (uVar24 == 0) {
          return (JsArrayKills)aVar20.field_0;
        }
      }
      else {
        aVar20.bits = bVar8 << 5;
        if ((uVar2 >> 0x12 & 1) == 0) {
          if (uVar24 == 0) {
            return (JsArrayKills)aVar20;
          }
          goto LAB_00444e19;
        }
LAB_004449e2:
        aVar20.bits = bVar8 << 5 | 0x40;
LAB_00444e00:
        if (uVar24 == 0) {
          return (JsArrayKills)aVar20.field_0;
        }
        if (pLStack_40 != (Loop *)0x0) goto LAB_00444e19;
      }
      bVar7 = ValueType::IsArray((ValueType *)&local_38.field_0);
      if (bVar7) {
        return (JsArrayKills)aVar20.field_0;
      }
LAB_00444e19:
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(aVar20.bits | 4);
    }
    if (((Loop *)instr)->loopTopLabel == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x35e3,"(instr->GetSrc2())","instr->GetSrc2()");
      if (!bVar7) goto LAB_00444ecb;
      *puVar14 = 0;
    }
    pBVar21 = ((Loop *)instr)->landingPad;
    local_44 = uVar2;
    if (pBVar21 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x35e5,"(arrayOpnd)","arrayOpnd");
      if (!bVar7) goto LAB_00444ecb;
      *puVar14 = 0;
    }
    local_34 = ((ValueType *)&pBVar21->prev)->field_0;
    OVar10 = IR::Opnd::GetKind((Opnd *)pBVar21);
    if (OVar10 != OpndKindReg) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    if (pLStack_40 == (Loop *)0x0) {
      bVar7 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_34.field_0);
      if (bVar7) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      aVar20.bits = (byte)(uVar24 >> 0xe);
      aVar23.bits = aVar20.bits + '0';
      if (!bVar8) {
        aVar23.bits = aVar20.bits;
      }
      if ((local_44 >> 0x12 & 1) == 0) goto LAB_00444e5a;
      bVar7 = ValueType::IsNotArray((ValueType *)&local_34.field_0);
      if (!bVar7) goto LAB_00444c2e;
      if (local_31 == '\0') {
        return (JsArrayKills)aVar23;
      }
    }
    else {
      aVar20.bits = (byte)(uVar24 >> 0xe);
      aVar23.bits = aVar20.bits + '0';
      if (!bVar8) {
        aVar23.bits = aVar20.bits;
      }
      if ((local_44 >> 0x12 & 1) == 0) {
        if (local_31 == '\0') {
          return (JsArrayKills)aVar23.field_0;
        }
        goto LAB_00444ec2;
      }
LAB_00444c2e:
      aVar23.bits = aVar23.bits | 0x40;
LAB_00444e5a:
      if (local_31 == '\0') {
        return (JsArrayKills)aVar23.field_0;
      }
      if (pLStack_40 != (Loop *)0x0) goto LAB_00444ec2;
    }
    bVar7 = ValueType::IsNativeArray((ValueType *)&local_34.field_0);
    if (bVar7) {
      bVar7 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_34.field_0);
      if ((bVar7) && ((((Loop *)instr)->loopTopLabel->super_Instr).field_0xa == '\x03')) {
        return (JsArrayKills)aVar23.field_0;
      }
      bVar7 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_34.field_0);
      if ((bVar7) && ((byte)((((Loop *)instr)->loopTopLabel->super_Instr).field_0xa - 9) < 2)) {
        return (JsArrayKills)aVar23.field_0;
      }
    }
    bVar7 = ValueType::IsNotNativeArray((ValueType *)&local_34.field_0);
    if (bVar7) {
      return (JsArrayKills)aVar23.field_0;
    }
    goto LAB_00444ec2;
  }
  if (uVar1 != 0x1bb) {
    if (uVar12 == 0x1e9) {
      pBVar21 = ((Loop *)instr)->landingPad;
      if (pBVar21 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3684,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar8) goto LAB_00444ecb;
        *puVar14 = 0;
        pBVar21 = ((Loop *)instr)->landingPad;
      }
      iVar13 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x19])();
      bVar8 = IR::AddrOpnd::IsEqualAddr((Opnd *)pBVar21,(void *)CONCAT44(extraout_var,iVar13));
      if (!bVar7 || bVar8) {
        return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
      }
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x8;
    }
    if (uVar12 != 0x215) {
      return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
    }
    goto LAB_004448a6;
  }
  local_44 = uVar2;
  if (((Loop *)instr)->landingPad == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x362a,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar7) goto LAB_00444ecb;
    *puVar14 = 0;
  }
  this_00 = IR::Instr::FindCallArgumentOpnd(instr,1,(Instr **)0x0);
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x362e,"(arrayOpnd)","arrayOpnd");
    if (!bVar7) goto LAB_00444ecb;
    *puVar14 = 0;
  }
  local_36 = (this_00->m_valueType).field_0;
  OVar10 = IR::Opnd::GetKind(this_00);
  if (OVar10 != OpndKindReg) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
  }
  if ((pLStack_40 == (Loop *)0x0) &&
     (bVar7 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_36.field_0), bVar7)) {
    return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)0x0;
  }
  pHVar16 = IR::Opnd::AsHelperCallOpnd((Opnd *)((Loop *)instr)->landingPad);
  JVar3 = pHVar16->m_fnHelper;
  if (uVar24 == 0) {
    aVar23.bits = '\0';
  }
  else if (JVar3 - HelperArray_Reverse < 5) {
    aVar23.bits = (byte)(0x202000202 >> ((char)(JVar3 - HelperArray_Reverse) * '\b' & 0x3fU));
  }
  else {
    aVar23.bits = '\0';
  }
  if (((bVar8) && (JVar3 - HelperArray_Concat < 0x11)) &&
     ((0x1b001U >> (JVar3 - HelperArray_Concat & 0x1f) & 1) != 0)) {
    aVar23.bits = aVar23.bits | 0x30;
  }
  if ((local_44 >> 0x12 & 1) == 0) {
LAB_00444d9a:
    if (local_31 == '\0') {
      return (JsArrayKills)aVar23.field_0;
    }
    if (pLStack_40 == (Loop *)0x0) goto LAB_00444dab;
  }
  else {
    if ((pLStack_40 != (Loop *)0x0) ||
       (bVar7 = ValueType::IsNotArray((ValueType *)&local_36.field_0), !bVar7)) {
      if ((JVar3 - HelperArray_Shift < 4) && (JVar3 - HelperArray_Shift != 1)) {
        aVar23.bits = aVar23.bits | 0x40;
      }
      goto LAB_00444d9a;
    }
    if (local_31 == '\0') {
      return (JsArrayKills)aVar23.field_0;
    }
LAB_00444dab:
    bVar7 = ValueType::IsNotNativeArray((ValueType *)&local_36.field_0);
    if (bVar7) {
      return (JsArrayKills)aVar23.field_0;
    }
  }
  if ((4 < JVar3 - HelperArray_Reverse) && (JVar3 != HelperArray_Concat)) {
    return (JsArrayKills)aVar23.field_0;
  }
LAB_00444ec2:
  return (JsArrayKills)(anon_union_1_2_471f577c_for_JsArrayKills_0)(aVar23.bits | 8);
}

Assistant:

JsArrayKills
GlobOpt::CheckJsArrayKills(IR::Instr *const instr)
{
    Assert(instr);

    JsArrayKills kills;
    if(instr->UsesAllFields())
    {
        // Calls can (but are unlikely to) change a javascript array into an ES5 array, which may have different behavior for
        // index properties.
        kills.SetKillsAllArrays();
        return kills;
    }

    const bool doArrayMissingValueCheckHoist = DoArrayMissingValueCheckHoist();
    const bool doNativeArrayTypeSpec = DoNativeArrayTypeSpec();
    const bool doArraySegmentHoist = DoArraySegmentHoist(ValueType::GetObject(ObjectType::Array));
    Assert(doArraySegmentHoist == DoArraySegmentHoist(ValueType::GetObject(ObjectType::ObjectWithArray)));
    const bool doArrayLengthHoist = DoArrayLengthHoist();
    if(!doArrayMissingValueCheckHoist && !doNativeArrayTypeSpec && !doArraySegmentHoist && !doArrayLengthHoist)
    {
        return kills;
    }

    // The following operations may create missing values in an array in an unlikely circumstance. Even though they don't kill
    // the fact that the 'this' parameter is an array (when implicit calls are disabled), we don't have a way to say the value
    // type is definitely array but it likely has no missing values. So, these will kill the definite value type as well, making
    // it likely array, such that the array checks will have to be redone.
    const bool useValueTypes = !IsLoopPrePass(); // Source value types are not guaranteed to be correct in a loop prepass
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
        {
            Assert(instr->GetDst());
            if(!instr->GetDst()->IsIndirOpnd())
            {
                break;
            }
            const ValueType baseValueType =
                useValueTypes ? instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType() : ValueType::Uninitialized;
            if(useValueTypes && baseValueType.IsNotArrayOrObjectWithArray())
            {
                break;
            }
            if(instr->IsProfiledInstr())
            {
                const Js::StElemInfo *const stElemInfo = instr->AsProfiledInstr()->u.stElemInfo;
                if(doArraySegmentHoist && stElemInfo->LikelyStoresOutsideHeadSegmentBounds())
                {
                    kills.SetKillsArrayHeadSegments();
                    kills.SetKillsArrayHeadSegmentLengths();
                }
                if(doArrayLengthHoist &&
                    !(useValueTypes && baseValueType.IsNotArray()) &&
                    stElemInfo->LikelyStoresOutsideArrayBounds())
                {
                    kills.SetKillsArrayLengths();
                }
            }
            break;
        }

        case Js::OpCode::DeleteElemI_A:
        case Js::OpCode::DeleteElemIStrict_A:
            Assert(instr->GetSrc1());
            if(!instr->GetSrc1()->IsIndirOpnd() ||
                (useValueTypes && instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsNotArrayOrObjectWithArray()))
            {
                break;
            }
            if(doArrayMissingValueCheckHoist)
            {
                kills.SetKillsArraysWithNoMissingValues();
            }
            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }
            break;

        case Js::OpCode::ConsoleScopedStFld:
        case Js::OpCode::ConsoleScopedStFldStrict:
        case Js::OpCode::ScopedStFld:
        case Js::OpCode::ScopedStFldStrict:
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
        case Js::OpCode::StSuperFld:
        case Js::OpCode::StSuperFldStrict:
        {
            Assert(instr->GetDst());

            if(!doArraySegmentHoist && !doArrayLengthHoist)
            {
                break;
            }

            IR::SymOpnd *const symDst = instr->GetDst()->AsSymOpnd();
            if(!symDst->IsPropertySymOpnd())
            {
                break;
            }

            IR::PropertySymOpnd *const dst = symDst->AsPropertySymOpnd();
            if(dst->m_sym->AsPropertySym()->m_propertyId != Js::PropertyIds::length)
            {
                break;
            }

            if(useValueTypes && dst->GetPropertyOwnerValueType().IsNotArray())
            {
                // Setting the 'length' property of an object that is not an array, even if it has an internal array, does
                // not kill the head segment or head segment length of any arrays.
                break;
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }
            if(doArrayLengthHoist)
            {
                kills.SetKillsArrayLengths();
            }
            break;
        }

        case Js::OpCode::InlineArrayPush:
        {
            Assert(instr->GetSrc2());
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);

            const ValueType arrayValueType(arrayOpnd->GetValueType());

            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doArrayMissingValueCheckHoist)
            {
                kills.SetKillsArraysWithNoMissingValues();
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegments();
                kills.SetKillsArrayHeadSegmentLengths();
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                kills.SetKillsArrayLengths();
            }

            // Don't kill NativeArray, if there is no mismatch between array's type and element's type.
            if(doNativeArrayTypeSpec &&
               !(useValueTypes && arrayValueType.IsNativeArray() &&
                    ((arrayValueType.IsLikelyNativeIntArray() && instr->GetSrc2()->IsInt32()) ||
                     (arrayValueType.IsLikelyNativeFloatArray() && instr->GetSrc2()->IsFloat()))
                ) &&
               !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                kills.SetKillsNativeArrays();
            }

            break;
        }

        case Js::OpCode::InlineArrayPop:
        {
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);

            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doArraySegmentHoist)
            {
                kills.SetKillsArrayHeadSegmentLengths();
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                kills.SetKillsArrayLengths();
            }

            if(doArrayMissingValueCheckHoist && !(useValueTypes && arrayValueType.IsArray()))
            {
                kills.SetKillsObjectArraysWithNoMissingValues();
            }
            break;
        }

        case Js::OpCode::CallDirect:
        {
            Assert(instr->GetSrc1());

            // Find the 'this' parameter and check if it's possible for it to be an array
            IR::Opnd *const arrayOpnd = instr->FindCallArgumentOpnd(1);
            Assert(arrayOpnd);
            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            const IR::JnHelperMethod helperMethod = instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper;
            if(doArrayMissingValueCheckHoist)
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                        kills.SetKillsArraysWithNoMissingValues();
                        break;
                }
            }

            if(doArraySegmentHoist)
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                    case IR::HelperArray_Concat:
                        kills.SetKillsArrayHeadSegments();
                        kills.SetKillsArrayHeadSegmentLengths();
                        break;
                }
            }

            if(doArrayLengthHoist && !(useValueTypes && arrayValueType.IsNotArray()))
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                        kills.SetKillsArrayLengths();
                        break;
                }
            }

            if(doNativeArrayTypeSpec && !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                switch(helperMethod)
                {
                    case IR::HelperArray_Reverse:
                    case IR::HelperArray_Shift:
                    case IR::HelperArray_Slice:
                    // Currently not inlined.
                    //case IR::HelperArray_Sort:
                    case IR::HelperArray_Splice:
                    case IR::HelperArray_Unshift:
                    case IR::HelperArray_Concat:
                        kills.SetKillsNativeArrays();
                        break;
                }
            }
            break;
        }

        case Js::OpCode::InitProto:
        {
            // Find the 'this' parameter and check if it's possible for it to be an array
            IR::Opnd *const arrayOpnd = instr->GetSrc1();
            Assert(arrayOpnd);
            const ValueType arrayValueType(arrayOpnd->GetValueType());
            if(!arrayOpnd->IsRegOpnd() || (useValueTypes && arrayValueType.IsNotArrayOrObjectWithArray()))
            {
                break;
            }

            if(doNativeArrayTypeSpec && !(useValueTypes && arrayValueType.IsNotNativeArray()))
            {
                kills.SetKillsNativeArrays();
            }
            break;
        }            

        case Js::OpCode::NewClassProto:
            Assert(instr->GetSrc1());
            if (IR::AddrOpnd::IsEqualAddr(instr->GetSrc1(), (void*)func->GetScriptContextInfo()->GetObjectPrototypeAddr()))
            {
                // No extends operand, the proto parent is the Object prototype
                break;
            }
            // Fall through
        case Js::OpCode::NewScObjectNoCtor:
        case Js::OpCode::NewScObjectNoCtorFull:
            if(doNativeArrayTypeSpec)
            {
                // Class/object construction can make something a prototype
                kills.SetKillsNativeArrays();
            }
            break;
    }

    return kills;
}